

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

void send_custom_headers(TadsServerThread *t,vm_val_t *headers)

{
  int iVar1;
  int __fd;
  void *__buf;
  ssize_t sVar2;
  size_t in_RCX;
  void *__buf_00;
  TadsServerThread *in_RDI;
  int in_R8D;
  char *h;
  vm_val_t ele;
  int i;
  int cnt;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  TadsServerThread *this;
  vm_val_t *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  vm_val_t *in_stack_ffffffffffffffd8;
  vm_val_t *in_stack_ffffffffffffffe0;
  undefined4 local_18;
  
  iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffffc8);
  local_18 = 1;
  do {
    if (iVar1 < local_18) {
      return;
    }
    vm_val_t::ll_index(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    in_stack_ffffffffffffffd0 =
         vm_val_t::get_as_string
                   ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (in_stack_ffffffffffffffd0 == (char *)0x0) {
      err_throw(0);
    }
    __fd = (int)in_stack_ffffffffffffffd0 + 2;
    this = in_RDI;
    __buf = (void *)vmb_get_len((char *)0x258b68);
    sVar2 = TadsServerThread::send(this,__fd,__buf,in_RCX,in_R8D);
    if ((int)sVar2 == 0) {
LAB_00258b95:
      TadsServerThread::last_error((TadsServerThread *)0x258b9f);
      throw_net_err((char *)this,in_stack_ffffffffffffffbc);
    }
    else {
      sVar2 = TadsServerThread::send(in_RDI,0x3a9435,__buf_00,in_RCX,in_R8D);
      if ((int)sVar2 == 0) goto LAB_00258b95;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void send_custom_headers(VMG_ TadsServerThread *t,
                                const vm_val_t *headers)
{
    /* send each header */
    int cnt = headers->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this list element */
        vm_val_t ele;
        headers->ll_index(vmg_ &ele, i);

        /* it has to be a string */
        const char *h = ele.get_as_string(vmg0_);
        if (h == 0)
            err_throw(VMERR_STRING_VAL_REQD);

        /* send the header string and the CR-LF */
        if (!t->send(h + VMB_LEN, vmb_get_len(h)) || !t->send("\r\n"))
            throw_net_err(vmg_ "HTTPRequest: error sending headers",
                          t->last_error());
    }
}